

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

bool __thiscall
iDynTree::SimpleLeggedOdometry::changeFixedFrame(SimpleLeggedOdometry *this,string *newFixedFrame)

{
  long lVar1;
  string *in_RDI;
  FrameIndex newFixedFrameIndex;
  FrameIndex in_stack_00000170;
  SimpleLeggedOdometry *in_stack_00000178;
  bool local_1;
  
  lVar1 = iDynTree::Model::getFrameIndex(in_RDI);
  if (lVar1 == FRAME_INVALID_INDEX) {
    iDynTree::reportError
              ("SimpleLeggedOdometry","changeFixedFrame",
               "changeFixedFrame was called, but the provided new fixed frame is unknown.");
    local_1 = false;
  }
  else {
    local_1 = changeFixedFrame(in_stack_00000178,in_stack_00000170);
  }
  return local_1;
}

Assistant:

bool SimpleLeggedOdometry::changeFixedFrame(const std::string& newFixedFrame)
{
    iDynTree::FrameIndex newFixedFrameIndex = this->m_model.getFrameIndex(newFixedFrame);

    if( newFixedFrameIndex == FRAME_INVALID_INDEX )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the provided new fixed frame is unknown.");
        return false;
    }

    return this->changeFixedFrame(newFixedFrameIndex);
}